

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainReal.c
# Opt level: O0

int TypeCheck(Abc_Frame_t *pAbc,char *s)

{
  int iVar1;
  char *s_local;
  Abc_Frame_t *pAbc_local;
  
  iVar1 = strcmp(s,"blif");
  if (iVar1 == 0) {
    pAbc_local._4_4_ = 1;
  }
  else {
    iVar1 = strcmp(s,"bench");
    if (iVar1 == 0) {
      pAbc_local._4_4_ = 1;
    }
    else {
      iVar1 = strcmp(s,"pla");
      if (iVar1 == 0) {
        pAbc_local._4_4_ = 1;
      }
      else {
        iVar1 = strcmp(s,"none");
        if (iVar1 == 0) {
          pAbc_local._4_4_ = 1;
        }
        else {
          fprintf((FILE *)pAbc->Err,"unknown type %s\n",s);
          pAbc_local._4_4_ = 0;
        }
      }
    }
  }
  return pAbc_local._4_4_;
}

Assistant:

static int TypeCheck( Abc_Frame_t * pAbc, const char * s )
{
    if (strcmp(s, "blif") == 0)
        return 1;
    else if (strcmp(s, "bench") == 0)
        return 1;
    else if (strcmp(s, "pla") == 0)
        return 1;
    else if (strcmp(s, "none") == 0)
        return 1;
    else {
        fprintf( pAbc->Err, "unknown type %s\n", s );
        return 0;
    }
}